

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeMultipleTexturesCase::verifyResult
          (DecodeMultipleTexturesCase *this)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  reference a;
  reference b;
  MessageBuilder *pMVar2;
  allocator<char> local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  MessageBuilder local_450;
  undefined4 local_2d0;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  MessageBuilder local_2a8;
  Vector<bool,_4> local_128;
  Vector<float,_4> local_124;
  allocator<char> local_111;
  string local_110;
  Vector<float,_4> local_ec;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_a8 [48];
  _func_int **pp_Stack_78;
  Vec4 pixelExpected1;
  undefined1 auStack_58 [8];
  Vec4 pixelExpected0;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  int resultColorIdx;
  TestLog *log;
  DecodeMultipleTexturesCase *this_local;
  
  this_00 = gles31::Context::getTestContext((this->super_SRGBTestCase).super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_58);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&pp_Stack_78);
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  getColorReferenceSRGB();
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)(local_a8 + 0x20),(Vec4 *)this);
  auStack_58 = (undefined1  [8])local_a8._32_8_;
  pixelExpected0.m_data[0] = (float)local_a8._40_4_;
  pixelExpected0.m_data[1] = (float)local_a8._44_4_;
  getColorReferenceLinear();
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)local_a8,(Vec4 *)this);
  pp_Stack_78 = (_func_int **)local_a8._0_8_;
  pixelExpected1.m_data[0] = (float)local_a8._8_4_;
  pixelExpected1.m_data[1] = (float)local_a8._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Expected color: ",&local_d9);
  tcu::Vector<float,_4>::Vector(&local_ec,(Vector<float,_4> *)auStack_58);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,&local_d8,0,&local_ec);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Expected color: ",&local_111);
  tcu::Vector<float,_4>::Vector(&local_124,(Vector<float,_4> *)&pp_Stack_78);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,&local_110,1,&local_124);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  a = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40,
                 0);
  b = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40,
                 1);
  tcu::equal<float,4>((tcu *)&local_128,a,b);
  bVar1 = tcu::boolAll<4>(&local_128);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    tcu::TestLog::operator<<(&local_2a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"texel values are different",&local_2c9);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_2a8,&local_2c8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    tcu::MessageBuilder::~MessageBuilder(&local_2a8);
  }
  else {
    tcu::TestLog::operator<<(&local_450,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"texel values are equal",&local_471);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_450,&local_470);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    tcu::MessageBuilder::~MessageBuilder(&local_450);
  }
  local_2d0 = 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  return bVar1;
}

Assistant:

bool DecodeMultipleTexturesCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelExpected0;
	tcu::Vec4				pixelExpected1;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelExpected0 = this->formatReferenceColor(getColorReferenceSRGB());
	pixelExpected1 = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected0);
	this->logColor(std::string("Expected color: "), resultColorIdx +1, pixelExpected1);

	//	check if the two textures have different values i.e. uTexture0 = sRGB and uTexture1 = linear
	if ( !(tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], pixelResultList[resultColorIdx +1]))) )
	{
		log << tcu::TestLog::Message << std::string("texel values are different") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("texel values are equal") << tcu::TestLog::EndMessage;
		return false;
	}
}